

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

NType duckdb::Node::GetNodeType(idx_t count)

{
  NType NVar1;
  
  NVar1 = NODE_4;
  if ((4 < count) && (NVar1 = NODE_16, 0x10 < count)) {
    NVar1 = NODE_256 - (count < 0x31);
  }
  return NVar1;
}

Assistant:

NType Node::GetNodeType(idx_t count) {
	if (count <= Node4::CAPACITY) {
		return NType::NODE_4;
	} else if (count <= Node16::CAPACITY) {
		return NType::NODE_16;
	} else if (count <= Node48::CAPACITY) {
		return NType::NODE_48;
	}
	return NType::NODE_256;
}